

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O0

void test_regular(rtr_socket *socket)

{
  int iVar1;
  long in_FS_OFFSET;
  rtr_socket *socket_local;
  undefined4 local_460;
  undefined4 local_45c;
  undefined4 local_458;
  undefined4 local_454;
  undefined4 local_450;
  undefined4 local_44c;
  undefined4 local_448;
  undefined4 local_444;
  undefined4 local_440;
  undefined4 local_43c;
  undefined1 local_438 [8];
  aspa_record _records622 [4];
  undefined4 local_3c8;
  undefined4 local_3c4;
  undefined4 local_3c0;
  undefined4 local_3bc;
  undefined4 local_3b8;
  undefined4 local_3b4;
  undefined4 local_3b0;
  undefined4 local_3ac;
  undefined4 local_3a8;
  undefined4 local_3a4;
  undefined4 local_3a0;
  undefined4 local_39c;
  undefined1 local_398 [8];
  aspa_record _records595 [4];
  undefined4 local_328;
  undefined4 local_324;
  undefined4 local_320;
  undefined4 local_31c;
  undefined4 local_318;
  undefined4 local_314;
  undefined4 local_310;
  undefined4 local_30c;
  undefined1 local_308 [8];
  update_callback _callbacks585 [4];
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined4 local_24c;
  undefined4 local_248;
  undefined4 local_244;
  undefined4 local_240;
  undefined4 local_23c;
  undefined4 local_238;
  undefined4 local_234;
  undefined4 local_230;
  undefined4 local_22c;
  undefined4 local_228;
  undefined4 local_224;
  undefined4 local_220;
  undefined4 local_21c;
  undefined1 local_218 [8];
  aspa_record _records571 [4];
  undefined1 local_1a8 [8];
  update_callback _callbacks561 [1];
  uint32_t local_178 [16];
  undefined1 local_138 [8];
  aspa_record _records553 [3];
  undefined4 local_e8;
  undefined4 local_e4;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined1 local_b8 [8];
  update_callback _callbacks544 [3];
  uint32_t local_30 [8];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  begin_cache_response('\x02',0);
  local_30[4] = 0x44d;
  local_30[5] = 0x44e;
  local_30[6] = 0x44f;
  local_30[7] = 0x450;
  append_aspa('\x02','\x01',0x44c,local_30 + 4,4);
  local_30[0] = 0x44c;
  local_30[1] = 0x44e;
  local_30[2] = 0x44f;
  local_30[3] = 0x450;
  append_aspa('\x02','\x01',0x44d,local_30,4);
  _callbacks544[2].type = 0x99;
  _callbacks544[2]._33_3_ = 8;
  _callbacks544[2]._36_4_ = 0x89a;
  append_aspa('\x02','\x01',0x898,(uint32_t *)&_callbacks544[2].type,4);
  end_cache_response('\x02',0,0x1b5);
  local_b8 = (undefined1  [8])0x0;
  _callbacks544[0].source._0_4_ = 0x44c;
  _callbacks544[0].record.customer_asn = 4;
  _callbacks544[0].record._4_4_ = 0;
  local_c8 = 0x44d;
  local_c4 = 0x44e;
  local_c0 = 0x44f;
  local_bc = 0x450;
  _callbacks544[0].record.provider_count = (size_t)&local_c8;
  _callbacks544[0].record.provider_asns._0_1_ = 1;
  _callbacks544[0].type = ASPA_REMOVE;
  _callbacks544[0]._33_7_ = 0;
  _callbacks544[1].source._0_4_ = 0x44d;
  _callbacks544[1].record.customer_asn = 4;
  _callbacks544[1].record._4_4_ = 0;
  local_d8 = 0x44c;
  local_d4 = 0x44e;
  local_d0 = 0x44f;
  local_cc = 0x450;
  _callbacks544[1].record.provider_count = (size_t)&local_d8;
  _callbacks544[1].record.provider_asns._0_1_ = 1;
  _callbacks544[1].type = ASPA_REMOVE;
  _callbacks544[1]._33_7_ = 0;
  _callbacks544[2].source._0_4_ = 0x898;
  _callbacks544[2].record.customer_asn = 4;
  _callbacks544[2].record._4_4_ = 0;
  local_e8 = 0x899;
  local_e4 = 0x89a;
  local_e0 = 0x89b;
  local_dc = 0x89c;
  _callbacks544[2].record.provider_count = (size_t)&local_e8;
  _callbacks544[2].record.provider_asns._0_1_ = 1;
  expect_update_callbacks((update_callback *)local_b8,3);
  iVar1 = rtr_sync(socket);
  if (iVar1 != 0) {
    __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x222,"void test_regular(struct rtr_socket *)");
  }
  if (callback_index != callback_count) {
    __assert_fail("callback_index == callback_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x223,"void test_regular(struct rtr_socket *)");
  }
  local_138._0_4_ = 0x44c;
  _records553[0].customer_asn = 4;
  _records553[0]._4_4_ = 0;
  local_178[0xc] = 0x44d;
  local_178[0xd] = 0x44e;
  local_178[0xe] = 0x44f;
  local_178[0xf] = 0x450;
  _records553[0].provider_count = (size_t)(local_178 + 0xc);
  _records553[0].provider_asns._0_4_ = 0x44d;
  _records553[1].customer_asn = 4;
  _records553[1]._4_4_ = 0;
  local_178[8] = 0x44c;
  local_178[9] = 0x44e;
  local_178[10] = 0x44f;
  local_178[0xb] = 0x450;
  _records553[1].provider_count = (size_t)(local_178 + 8);
  _records553[1].provider_asns._0_4_ = 0x898;
  _records553[2].customer_asn = 4;
  _records553[2]._4_4_ = 0;
  local_178[4] = 0x899;
  local_178[5] = 0x89a;
  local_178[6] = 0x89b;
  local_178[7] = 0x89c;
  _records553[2].provider_count = (size_t)(local_178 + 4);
  assert_table(socket,(aspa_record *)local_138,3);
  begin_cache_response('\x02',0);
  local_178[0] = 0xce5;
  local_178[1] = 0xce6;
  local_178[2] = 0xce7;
  local_178[3] = 0xce8;
  append_aspa('\x02','\x01',0xce4,local_178,4);
  end_cache_response('\x02',0,0x1bc);
  local_1a8 = (undefined1  [8])0x0;
  _callbacks561[0].source._0_4_ = 0xce4;
  _callbacks561[0].record.customer_asn = 4;
  _callbacks561[0].record._4_4_ = 0;
  _records571[3].provider_asns._0_4_ = 0xce5;
  _records571[3].provider_asns._4_4_ = 0xce6;
  _callbacks561[0].record.provider_count = (size_t)&_records571[3].provider_asns;
  _callbacks561[0].record.provider_asns._0_1_ = 1;
  expect_update_callbacks((update_callback *)local_1a8,1);
  iVar1 = rtr_sync(socket);
  if (iVar1 != 0) {
    __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x233,"void test_regular(struct rtr_socket *)");
  }
  if (callback_index != callback_count) {
    __assert_fail("callback_index == callback_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x234,"void test_regular(struct rtr_socket *)");
  }
  local_218._0_4_ = 0x44c;
  _records571[0].customer_asn = 4;
  _records571[0]._4_4_ = 0;
  local_228 = 0x44d;
  local_224 = 0x44e;
  local_220 = 0x44f;
  local_21c = 0x450;
  _records571[0].provider_count = (size_t)&local_228;
  _records571[0].provider_asns._0_4_ = 0x44d;
  _records571[1].customer_asn = 4;
  _records571[1]._4_4_ = 0;
  local_238 = 0x44c;
  local_234 = 0x44e;
  local_230 = 0x44f;
  local_22c = 0x450;
  _records571[1].provider_count = (size_t)&local_238;
  _records571[1].provider_asns._0_4_ = 0x898;
  _records571[2].customer_asn = 4;
  _records571[2]._4_4_ = 0;
  local_248 = 0x899;
  local_244 = 0x89a;
  local_240 = 0x89b;
  local_23c = 0x89c;
  _records571[2].provider_count = (size_t)&local_248;
  _records571[2].provider_asns._0_4_ = 0xce4;
  _records571[3].customer_asn = 4;
  _records571[3]._4_4_ = 0;
  local_258 = 0xce5;
  local_254 = 0xce6;
  local_250 = 0xce7;
  local_24c = 0xce8;
  _records571[3].provider_count = (size_t)&local_258;
  assert_table(socket,(aspa_record *)local_218,4);
  begin_cache_response('\x02',0);
  append_aspa('\x02','\0',0x44c,(uint32_t *)0x0,0);
  append_aspa('\x02','\0',0x898,(uint32_t *)0x0,0);
  _callbacks585[3].type = 0xb1;
  _callbacks585[3]._33_3_ = 4;
  _callbacks585[3]._36_4_ = 0x4b2;
  append_aspa('\x02','\x01',0x44c,(uint32_t *)&_callbacks585[3].type,4);
  append_aspa('\x02','\x01',0,(uint32_t *)0x0,0);
  end_cache_response('\x02',0,0x1bc);
  local_308 = (undefined1  [8])0x0;
  _callbacks585[0].source._0_4_ = 0;
  _callbacks585[0].record.customer_asn = 0;
  _callbacks585[0].record._4_4_ = 0;
  _callbacks585[0].record.provider_count = 0;
  _callbacks585[0].record.provider_asns._0_1_ = 1;
  _callbacks585[0].type = ASPA_REMOVE;
  _callbacks585[0]._33_7_ = 0;
  _callbacks585[1].source._0_4_ = 0x44c;
  _callbacks585[1].record.customer_asn = 4;
  _callbacks585[1].record._4_4_ = 0;
  local_318 = 0x44d;
  local_314 = 0x44e;
  local_310 = 0x44f;
  local_30c = 0x450;
  _callbacks585[1].record.provider_count = (size_t)&local_318;
  _callbacks585[1].record.provider_asns._0_1_ = 0;
  _callbacks585[1].type = ASPA_REMOVE;
  _callbacks585[1]._33_7_ = 0;
  _callbacks585[2].source._0_4_ = 0x44c;
  _callbacks585[2].record.customer_asn = 4;
  _callbacks585[2].record._4_4_ = 0;
  local_328 = 0x4b1;
  local_324 = 0x4b2;
  local_320 = 0x4b3;
  local_31c = 0x4b4;
  _callbacks585[2].record.provider_count = (size_t)&local_328;
  _callbacks585[2].record.provider_asns._0_1_ = 1;
  _callbacks585[2].type = ASPA_REMOVE;
  _callbacks585[2]._33_7_ = 0;
  _callbacks585[3].source._0_4_ = 0x898;
  _callbacks585[3].record.customer_asn = 4;
  _callbacks585[3].record._4_4_ = 0;
  _records595[3].provider_asns._0_4_ = 0x899;
  _records595[3].provider_asns._4_4_ = 0x89a;
  _callbacks585[3].record.provider_count = (size_t)&_records595[3].provider_asns;
  _callbacks585[3].record.provider_asns._0_1_ = 0;
  expect_update_callbacks((update_callback *)local_308,4);
  iVar1 = rtr_sync(socket);
  if (iVar1 != 0) {
    __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x24b,"void test_regular(struct rtr_socket *)");
  }
  if (callback_index != callback_count) {
    __assert_fail("callback_index == callback_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x24c,"void test_regular(struct rtr_socket *)");
  }
  local_398._0_4_ = 0;
  _records595[0].customer_asn = 0;
  _records595[0]._4_4_ = 0;
  _records595[0].provider_count = 0;
  _records595[0].provider_asns._0_4_ = 0x44c;
  _records595[1].customer_asn = 4;
  _records595[1]._4_4_ = 0;
  local_3a8 = 0x4b1;
  local_3a4 = 0x4b2;
  local_3a0 = 0x4b3;
  local_39c = 0x4b4;
  _records595[1].provider_count = (size_t)&local_3a8;
  _records595[1].provider_asns._0_4_ = 0x44d;
  _records595[2].customer_asn = 4;
  _records595[2]._4_4_ = 0;
  local_3b8 = 0x44c;
  local_3b4 = 0x44e;
  local_3b0 = 0x44f;
  local_3ac = 0x450;
  _records595[2].provider_count = (size_t)&local_3b8;
  _records595[2].provider_asns._0_4_ = 0xce4;
  _records595[3].customer_asn = 4;
  _records595[3]._4_4_ = 0;
  local_3c8 = 0xce5;
  local_3c4 = 0xce6;
  local_3c0 = 0xce7;
  local_3bc = 0xce8;
  _records595[3].provider_count = (size_t)&local_3c8;
  assert_table(socket,(aspa_record *)local_398,4);
  begin_cache_response('\x02',0);
  _records622[3].provider_asns._0_4_ = 0x4b1;
  _records622[3].provider_asns._4_4_ = 0x4b2;
  append_aspa('\x02','\x01',0x76d,(uint32_t *)&_records622[3].provider_asns,4);
  append_aspa('\x02','\0',0x76d,(uint32_t *)0x0,0);
  end_cache_response('\x02',0,0x1bc);
  printf("Ignoring No-Ops!");
  expect_update_callbacks((update_callback *)0x0,0);
  iVar1 = rtr_sync(socket);
  if (iVar1 != 0) {
    __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x266,"void test_regular(struct rtr_socket *)");
  }
  if (callback_index == callback_count) {
    local_438._0_4_ = 0;
    _records622[0].customer_asn = 0;
    _records622[0]._4_4_ = 0;
    _records622[0].provider_count = 0;
    _records622[0].provider_asns._0_4_ = 0x44c;
    _records622[1].customer_asn = 4;
    _records622[1]._4_4_ = 0;
    local_448 = 0x4b1;
    local_444 = 0x4b2;
    local_440 = 0x4b3;
    local_43c = 0x4b4;
    _records622[1].provider_count = (size_t)&local_448;
    _records622[1].provider_asns._0_4_ = 0x44d;
    _records622[2].customer_asn = 4;
    _records622[2]._4_4_ = 0;
    local_458 = 0x44c;
    local_454 = 0x44e;
    local_450 = 0x44f;
    local_44c = 0x450;
    _records622[2].provider_count = (size_t)&local_458;
    _records622[2].provider_asns._0_4_ = 0xce4;
    _records622[3].customer_asn = 4;
    _records622[3]._4_4_ = 0;
    socket_local._0_4_ = 0xce5;
    socket_local._4_4_ = 0xce6;
    local_460 = 0xce7;
    local_45c = 0xce8;
    _records622[3].provider_count = (size_t)&socket_local;
    assert_table(socket,(aspa_record *)local_438,4);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("callback_index == callback_count",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                ,0x267,"void test_regular(struct rtr_socket *)");
}

Assistant:

static void test_regular(struct rtr_socket *socket)
{
	// Test: regular announcements and withdrawals
	// Expect: OK
	// DB: withdrawn records get removed, newly announced are added

	begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 1100, ASNS(1101, 1102, 1103, 1104));
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 1101, ASNS(1100, 1102, 1103, 1104));
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 2200, ASNS(2201, 2202, 2203, 2204));
	end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 437);

	EXPECT_UPDATE_CALLBACKS(
		ADDED(RECORD(1100, ASNS(1101, 1102, 1103, 1104))),
		ADDED(RECORD(1101, ASNS(1100, 1102, 1103, 1104))),
		ADDED(RECORD(2200, ASNS(2201, 2202, 2203, 2204))),
	);

	assert(rtr_sync(socket) == RTR_SUCCESS);
	assert(callback_index == callback_count);

	ASSERT_TABLE(socket,
		RECORD(1100, ASNS(1101, 1102, 1103, 1104)),
		RECORD(1101, ASNS(1100, 1102, 1103, 1104)),
		RECORD(2200, ASNS(2201, 2202, 2203, 2204)),
	);

	begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 3300, ASNS(3301, 3302, 3303, 3304));
	end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 444);

	EXPECT_UPDATE_CALLBACKS(
		ADDED(RECORD(3300, ASNS(3301, 3302, 3303, 3304))),
	);

	assert(rtr_sync(socket) == RTR_SUCCESS);
	assert(callback_index == callback_count);

	ASSERT_TABLE(socket,
		RECORD(1100, ASNS(1101, 1102, 1103, 1104)),
		RECORD(1101, ASNS(1100, 1102, 1103, 1104)),
		RECORD(2200, ASNS(2201, 2202, 2203, 2204)),
		RECORD(3300, ASNS(3301, 3302, 3303, 3304))
	);

	begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_WITHDRAW, 1100, ASNS());
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_WITHDRAW, 2200, ASNS());
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 1100, ASNS(1201, 1202, 1203, 1204));
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 0, ASNS());
	end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 444);

	EXPECT_UPDATE_CALLBACKS(
		ADDED(RECORD(0, ASNS())),
		REMOVED(RECORD(1100, ASNS(1101, 1102, 1103, 1104))),
		ADDED(RECORD(1100, ASNS(1201, 1202, 1203, 1204))),
		REMOVED(RECORD(2200, ASNS(2201, 2202, 2203, 2204))),
	);

	assert(rtr_sync(socket) == RTR_SUCCESS);
	assert(callback_index == callback_count);

	ASSERT_TABLE(socket,
		RECORD(0, ASNS()),
		RECORD(1100, ASNS(1201, 1202, 1203, 1204)),
		RECORD(1101, ASNS(1100, 1102, 1103, 1104)),
		RECORD(3300, ASNS(3301, 3302, 3303, 3304)),
	);

	begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
	// The following two are complementary (no-op)
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 1901, ASNS(1201, 1202, 1203, 1204));
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_WITHDRAW, 1901, ASNS());
	end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 444);

#if ASPA_NOTIFY_NO_OPS
	printf("Notifying No-Ops!");
	EXPECT_UPDATE_CALLBACKS(
		ADDED(RECORD(1901, ASNS(1201, 1202, 1203, 1204))),
		REMOVED(RECORD(1901, ASNS(1201, 1202, 1203, 1204))),
	);
#else
	printf("Ignoring No-Ops!");
	EXPECT_NO_UPDATE_CALLBACKS();
#endif

	assert(rtr_sync(socket) == RTR_SUCCESS);
	assert(callback_index == callback_count);

	ASSERT_TABLE(socket,
		RECORD(0, ASNS()),
		RECORD(1100, ASNS(1201, 1202, 1203, 1204)),
		RECORD(1101, ASNS(1100, 1102, 1103, 1104)),
		RECORD(3300, ASNS(3301, 3302, 3303, 3304)),
	);
}